

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O0

int fcntl(int __fd,int __cmd,...)

{
  char in_AL;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_1d8;
  undefined8 *local_1c0;
  undefined8 *local_1a8;
  uint *local_190;
  uint *local_178;
  uint *local_160;
  uint *local_148;
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  flock *local_70;
  flock *local_68;
  flock *local_60;
  uint local_58;
  int local_54;
  int flag;
  int local_4c;
  int local_48;
  int param;
  rpchook_t *lp;
  uint local_38;
  int ret;
  va_list arg_list;
  int cmd_local;
  int fildes_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_118 = in_RDX;
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  if (g_sys_fcntl_func == (fcntl_pfn_t)0x0) {
    g_sys_fcntl_func = (fcntl_pfn_t)dlsym(0xffffffffffffffff,"fcntl");
  }
  if (__fd < 0) {
    cmd_local = 0x2cf;
  }
  else {
    arg_list[0].overflow_arg_area = local_128;
    arg_list[0]._0_8_ = &stack0x00000008;
    ret = 0x30;
    local_38 = 0x10;
    lp._4_4_ = 0xffffffff;
    _local_48 = get_by_fd(__fd);
    switch(__cmd) {
    case 0:
      if (local_38 < 0x29) {
        local_148 = (uint *)((long)(int)local_38 + (long)arg_list[0].overflow_arg_area);
        local_38 = local_38 + 8;
      }
      else {
        local_148 = (uint *)arg_list[0]._0_8_;
        arg_list[0]._0_8_ = arg_list[0]._0_8_ + 8;
      }
      local_4c = *local_148;
      lp._4_4_ = (*g_sys_fcntl_func)(__fd,__cmd,(ulong)(uint)local_4c);
      break;
    case 1:
      lp._4_4_ = (*g_sys_fcntl_func)(__fd,__cmd);
      if ((_local_48 != (rpchook_t *)0x0) && ((_local_48->user_flag & 0x800U) == 0)) {
        lp._4_4_ = lp._4_4_ & 0xfffff7ff;
      }
      break;
    case 2:
      if (local_38 < 0x29) {
        local_160 = (uint *)((long)(int)local_38 + (long)arg_list[0].overflow_arg_area);
        local_38 = local_38 + 8;
      }
      else {
        local_160 = (uint *)arg_list[0]._0_8_;
        arg_list[0]._0_8_ = arg_list[0]._0_8_ + 8;
      }
      flag = *local_160;
      lp._4_4_ = (*g_sys_fcntl_func)(__fd,__cmd,(ulong)(uint)flag);
      break;
    case 3:
      lp._4_4_ = (*g_sys_fcntl_func)(__fd,__cmd);
      break;
    case 4:
      if (local_38 < 0x29) {
        local_178 = (uint *)((long)(int)local_38 + (long)arg_list[0].overflow_arg_area);
        local_38 = local_38 + 8;
      }
      else {
        local_178 = (uint *)arg_list[0]._0_8_;
        arg_list[0]._0_8_ = arg_list[0]._0_8_ + 8;
      }
      local_58 = *local_178;
      local_54 = local_58;
      bVar1 = co_is_enable_sys_hook();
      if ((bVar1) && (_local_48 != (rpchook_t *)0x0)) {
        local_58 = local_58 | 0x800;
      }
      lp._4_4_ = (*g_sys_fcntl_func)(__fd,__cmd,(ulong)local_58);
      if ((lp._4_4_ == 0) && (_local_48 != (rpchook_t *)0x0)) {
        _local_48->user_flag = local_54;
      }
      break;
    case 5:
      if (local_38 < 0x29) {
        local_1a8 = (undefined8 *)((long)(int)local_38 + (long)arg_list[0].overflow_arg_area);
        local_38 = local_38 + 8;
      }
      else {
        local_1a8 = (undefined8 *)arg_list[0]._0_8_;
        arg_list[0]._0_8_ = arg_list[0]._0_8_ + 8;
      }
      local_68 = (flock *)*local_1a8;
      lp._4_4_ = (*g_sys_fcntl_func)(__fd,__cmd,local_68);
      break;
    case 6:
      if (local_38 < 0x29) {
        local_1c0 = (undefined8 *)((long)(int)local_38 + (long)arg_list[0].overflow_arg_area);
        local_38 = local_38 + 8;
      }
      else {
        local_1c0 = (undefined8 *)arg_list[0]._0_8_;
        arg_list[0]._0_8_ = arg_list[0]._0_8_ + 8;
      }
      local_70 = (flock *)*local_1c0;
      lp._4_4_ = (*g_sys_fcntl_func)(__fd,__cmd,local_70);
      break;
    case 7:
      if (local_38 < 0x29) {
        local_1d8 = (undefined8 *)((long)(int)local_38 + (long)arg_list[0].overflow_arg_area);
        local_38 = local_38 + 8;
      }
      else {
        local_1d8 = (undefined8 *)arg_list[0]._0_8_;
        arg_list[0]._0_8_ = arg_list[0]._0_8_ + 8;
      }
      local_78 = *local_1d8;
      lp._4_4_ = (*g_sys_fcntl_func)(__fd,__cmd,local_78);
      break;
    case 8:
      if (local_38 < 0x29) {
        local_190 = (uint *)((long)(int)local_38 + (long)arg_list[0].overflow_arg_area);
        local_38 = local_38 + 8;
      }
      else {
        local_190 = (uint *)arg_list[0]._0_8_;
        arg_list[0]._0_8_ = arg_list[0]._0_8_ + 8;
      }
      local_60._4_4_ = *local_190;
      lp._4_4_ = (*g_sys_fcntl_func)(__fd,__cmd,(ulong)local_60._4_4_);
      break;
    case 9:
      lp._4_4_ = (*g_sys_fcntl_func)(__fd,__cmd);
    }
    cmd_local = lp._4_4_;
  }
  return cmd_local;
}

Assistant:

int fcntl(int fildes, int cmd, ...)
{
	HOOK_SYS_FUNC( fcntl );

	if( fildes < 0 )
	{
		return __LINE__;
	}

	va_list arg_list;
	va_start( arg_list,cmd );

	int ret = -1;
	rpchook_t *lp = get_by_fd( fildes );
	switch( cmd )
	{
		case F_DUPFD:
		{
			int param = va_arg(arg_list,int);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
		case F_GETFD:
		{
			ret = g_sys_fcntl_func( fildes,cmd );
      if (lp && !(lp->user_flag & O_NONBLOCK)) {
          ret = ret & (~O_NONBLOCK);
      }
			break;
		}
		case F_SETFD:
		{
			int param = va_arg(arg_list,int);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
		case F_GETFL:
		{
			ret = g_sys_fcntl_func( fildes,cmd );
			break;
		}
		case F_SETFL:
		{
			int param = va_arg(arg_list,int);
			int flag = param;
			if( co_is_enable_sys_hook() && lp )
			{
				flag |= O_NONBLOCK;
			}
			ret = g_sys_fcntl_func( fildes,cmd,flag );
			if( 0 == ret && lp )
			{
				lp->user_flag = param;
			}
			break;
		}
		case F_GETOWN:
		{
			ret = g_sys_fcntl_func( fildes,cmd );
			break;
		}
		case F_SETOWN:
		{
			int param = va_arg(arg_list,int);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
		case F_GETLK:
		{
			struct flock *param = va_arg(arg_list,struct flock *);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
		case F_SETLK:
		{
			struct flock *param = va_arg(arg_list,struct flock *);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
		case F_SETLKW:
		{
			struct flock *param = va_arg(arg_list,struct flock *);
			ret = g_sys_fcntl_func( fildes,cmd,param );
			break;
		}
	}

	va_end( arg_list );

	return ret;
}